

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

Status __thiscall spvtools::opt::LoopPeelingPass::Process(LoopPeelingPass *this)

{
  bool bVar1;
  Status SVar2;
  IRContext *this_00;
  Module *this_01;
  reference f_00;
  bool bVar3;
  Function *f;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  Module *module;
  bool modified;
  LoopPeelingPass *this_local;
  
  bVar3 = false;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::module(this_00);
  join_0x00000010_0x00000000_ = Module::begin(this_01);
  _f = Module::end(this_01);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&f);
    if (!bVar1) break;
    f_00 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                     ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    bVar1 = ProcessFunction(this,f_00);
    bVar3 = bVar3 || bVar1;
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar2 = SuccessWithoutChange;
  if (bVar3) {
    SVar2 = SuccessWithChange;
  }
  return SVar2;
}

Assistant:

Pass::Status LoopPeelingPass::Process() {
  bool modified = false;
  Module* module = context()->module();

  // Process each function in the module
  for (Function& f : *module) {
    modified |= ProcessFunction(&f);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}